

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<short,short,short,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperatorOverflowCheck,bool,false,true>
               (short *ldata,short *rdata,short *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  unsigned_long *puVar1;
  ulong uVar2;
  short sVar3;
  short sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar8 = 0;
      sVar4 = *rdata;
      do {
        sVar3 = AddOperatorOverflowCheck::Operation<short,short,short>(ldata[iVar8],sVar4);
        result_data[iVar8] = sVar3;
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar9 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar6 = count;
        }
LAB_010652e8:
        uVar7 = uVar9;
        if (uVar9 < uVar6) {
          sVar4 = *rdata;
          do {
            sVar3 = AddOperatorOverflowCheck::Operation<short,short,short>(ldata[uVar9],sVar4);
            result_data[uVar9] = sVar3;
            uVar9 = uVar9 + 1;
            uVar7 = uVar6;
          } while (uVar6 != uVar9);
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar6 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar6 = count;
        }
        uVar7 = uVar6;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_010652e8;
          uVar7 = uVar9;
          if (uVar9 < uVar6) {
            uVar10 = 0;
            do {
              if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
                sVar4 = AddOperatorOverflowCheck::Operation<short,short,short>
                                  (ldata[uVar9 + uVar10],*rdata);
                result_data[uVar9 + uVar10] = sVar4;
              }
              uVar10 = uVar10 + 1;
              uVar7 = uVar6;
            } while (uVar6 - uVar9 != uVar10);
          }
        }
      }
      uVar5 = uVar5 + 1;
      uVar9 = uVar7;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}